

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::anon_unknown_0::ReportReflectionUsageError
               (Descriptor *descriptor,FieldDescriptor *field,char *method,char *description)

{
  LogMessage *this;
  LogMessage *other;
  FieldDescriptor *in_RSI;
  Descriptor *in_RDI;
  string *in_stack_ffffffffffffff48;
  LogMessage *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  LogMessage *in_stack_ffffffffffffff60;
  
  internal::LogMessage::LogMessage
            (in_stack_ffffffffffffff60,(LogLevel_conflict)((ulong)in_stack_ffffffffffffff58 >> 0x20)
             ,(char *)in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  internal::LogMessage::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
  internal::LogMessage::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
  internal::LogMessage::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
  Descriptor::full_name_abi_cxx11_(in_RDI);
  internal::LogMessage::operator<<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  internal::LogMessage::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
  FieldDescriptor::full_name_abi_cxx11_(in_RSI);
  internal::LogMessage::operator<<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  this = internal::LogMessage::operator<<
                   (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
  other = internal::LogMessage::operator<<(this,(char *)in_stack_ffffffffffffff48);
  internal::LogFinisher::operator=((LogFinisher *)this,other);
  internal::LogMessage::~LogMessage((LogMessage *)0x415b6d);
  return;
}

Assistant:

void ReportReflectionUsageError(const Descriptor* descriptor,
                                const FieldDescriptor* field,
                                const char* method, const char* description) {
  GOOGLE_LOG(FATAL) << "Protocol Buffer reflection usage error:\n"
                "  Method      : google::protobuf::Reflection::"
             << method
             << "\n"
                "  Message type: "
             << descriptor->full_name()
             << "\n"
                "  Field       : "
             << field->full_name()
             << "\n"
                "  Problem     : "
             << description;
}